

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.h
# Opt level: O2

uint __thiscall
Corrade::Utility::ConfigurationGroup::value<unsigned_int>
          (ConfigurationGroup *this,string *key,uint index,ConfigurationValueFlags flags)

{
  uint uVar1;
  string *stringValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined8 local_20;
  undefined8 local_18;
  
  stringValue = valueInternal(this,key,index,flags);
  if (stringValue != (string *)0x0) {
    uVar1 = Implementation::IntegerConfigurationValue<unsigned_int>::fromString(stringValue,flags);
    return uVar1;
  }
  local_20 = 0;
  local_18 = 0x8000000000000000;
  Containers::BasicStringView::operator_cast_to_string(&local_40,(BasicStringView *)&local_20);
  uVar1 = Implementation::IntegerConfigurationValue<unsigned_int>::fromString(&local_40,flags);
  std::__cxx11::string::~string((string *)&local_40);
  return uVar1;
}

Assistant:

inline T ConfigurationGroup::value(const std::string& key, const unsigned int index, const ConfigurationValueFlags flags) const {
    const std::string* value = valueInternal(key, index, flags);
    /* If the value is not found, it's important to *not* call fromString()
       with an empty std::string -- if T is a view, it would cause it to
       reference that temporary std::string, which is SSO'd on the stack. That
       wouldn't be a problem per-se given the view is empty, but with
       StringView a conversion from an empty std::string marks it as
       NullTerminated, and that's a problem because the stack location gets
       overwritten and the view pointing to it won't be null-terminated
       anymore. Asserting in the better case, causing some rogue memory access
       in the worse scenario.

       Instead, pass it a StringView -- the fromString() implementation is
       likely using it already anyway and so it'll properly not reference
       anything temporary, and if the implementation doesn't use StringView,
       it'll get implicitly converted to a temporary std::string instance. */
    /** @todo clean up once Configuration is STL-free */
    return value ?
        ConfigurationValue<T>::fromString(*value, flags) :
        ConfigurationValue<T>::fromString(Containers::StringView{}, flags);
}